

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  PathDeclarationSyntax *pPVar1;
  Token *unaff_retaddr;
  PathDescriptionSyntax *in_stack_00000008;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000010;
  BumpAllocator *in_stack_00000018;
  BumpAllocator *in_stack_00000028;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000030;
  Token *in_stack_00000038;
  BumpAllocator *in_stack_000000c8;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_000000d0;
  BumpAllocator *in_stack_ffffffffffffff78;
  PathDescriptionSyntax *in_stack_ffffffffffffff80;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000030,in_stack_00000028);
  not_null<slang::syntax::PathDescriptionSyntax_*>::operator*
            ((not_null<slang::syntax::PathDescriptionSyntax_*> *)0x94c77a);
  deepClone<slang::syntax::PathDescriptionSyntax>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  parsing::Token::deepClone((Token *)in_stack_000000d0,in_stack_000000c8);
  parsing::Token::deepClone((Token *)in_stack_000000d0,in_stack_000000c8);
  deepClone<slang::syntax::ExpressionSyntax>(in_stack_000000d0,in_stack_000000c8);
  parsing::Token::deepClone((Token *)in_stack_000000d0,in_stack_000000c8);
  parsing::Token::deepClone((Token *)in_stack_000000d0,in_stack_000000c8);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::PathDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::PathDescriptionSyntax&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (Token *)__fn,
                      (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)__child_stack,
                      (Token *)in_stack_00000030,in_stack_00000038);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const PathDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<PathDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone<PathDescriptionSyntax>(*node.desc, alloc),
        node.equals.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone(node.delays, alloc),
        node.closeParen.deepClone(alloc),
        node.semi.deepClone(alloc)
    );
}